

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_string_range(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  TRef tr;
  TRef TVar3;
  MSize MVar4;
  TRef TVar5;
  IRRef1 IVar6;
  long lVar7;
  uint tr_00;
  GCstr *s;
  IRRef1 IVar8;
  IRRef1 IVar9;
  long lVar10;
  int k;
  uint local_44;
  RecordFFData *local_40;
  GCstr *local_38;
  
  TVar1 = lj_ir_tostr(J,*J->base);
  IVar6 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op1 = IVar6;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x44130000;
  TVar1 = lj_opt_fold(J);
  TVar2 = lj_ir_kint(J,0);
  local_38 = argv2str(J,rd->argv);
  IVar8 = (IRRef1)TVar1;
  local_40 = rd;
  if (rd->data == 0) {
    if ((*(byte *)((long)J->base + 7) & 0x1f) == 0) {
      MVar4 = 1;
      tr = lj_ir_kint(J,1);
    }
    else {
      MVar4 = argv2int(J,rd->argv + 1);
      tr = lj_opt_narrow_toint(J,J->base[1]);
    }
    TVar3 = tr;
    local_44 = MVar4;
    if ((J->base[1] != 0) && (tr_00 = J->base[2], (tr_00 & 0x1f000000) != 0)) goto LAB_0013d747;
LAB_0013d76c:
    s = local_38;
    IVar9 = (IRRef1)TVar3;
    if (-1 < (int)MVar4) {
      if (local_38->len < MVar4) {
        (J->fold).ins.field_0.ot = 0x793;
        (J->fold).ins.field_0.op1 = IVar9;
        (J->fold).ins.field_0.op2 = IVar8;
        lj_opt_fold(J);
        MVar4 = s->len;
        TVar3 = TVar1;
      }
      else {
        (J->fold).ins.field_0.ot = 0x693;
        (J->fold).ins.field_0.op1 = IVar9;
        (J->fold).ins.field_0.op2 = IVar8;
        lj_opt_fold(J);
      }
      IVar8 = (IRRef1)TVar3;
      goto LAB_0013d87b;
    }
  }
  else {
    local_44 = argv2int(J,rd->argv + 1);
    tr = lj_opt_narrow_toint(J,J->base[1]);
    tr_00 = J->base[2];
    if ((tr_00 & 0x1f000000) != 0) {
LAB_0013d747:
      TVar3 = lj_opt_narrow_toint(J,tr_00);
      MVar4 = argv2int(J,rd->argv + 2);
      goto LAB_0013d76c;
    }
    MVar4 = 0xffffffff;
    TVar3 = lj_ir_kint(J,-1);
    IVar9 = (IRRef1)TVar3;
  }
  (J->fold).ins.field_0.ot = 0x93;
  (J->fold).ins.field_0.op1 = IVar9;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  lj_opt_fold(J);
  (J->fold).ins.field_0.ot = 0x2913;
  (J->fold).ins.field_0.op1 = IVar8;
  (J->fold).ins.field_0.op2 = IVar9;
  TVar3 = lj_opt_fold(J);
  TVar5 = lj_ir_kint(J,1);
  (J->fold).ins.field_0.ot = 0x2913;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
  TVar3 = lj_opt_fold(J);
  IVar8 = (IRRef1)TVar3;
  MVar4 = MVar4 + local_38->len + 1;
  s = local_38;
LAB_0013d87b:
  TVar1 = recff_string_start(J,s,(int32_t *)&local_44,tr,TVar1,TVar2);
  IVar9 = (IRRef1)TVar1;
  if (local_40->data == 0) {
    k = MVar4 - local_44;
    if (k < 1) {
      (J->fold).ins.field_0.ot = 0x293;
      (J->fold).ins.field_0.op1 = IVar8;
      (J->fold).ins.field_0.op2 = IVar9;
      lj_opt_fold(J);
      local_40->nres = 0;
    }
    else {
      lVar7 = (long)k;
      (J->fold).ins.field_0.ot = 0x2a13;
      (J->fold).ins.field_0.op1 = IVar8;
      (J->fold).ins.field_0.op2 = IVar9;
      TVar1 = lj_opt_fold(J);
      TVar2 = lj_ir_kint(J,k);
      (J->fold).ins.field_0.ot = 0x893;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
      lj_opt_fold(J);
      if (0xfa < (long)((ulong)J->baseslot + lVar7)) {
        lj_trace_err_info(J,LJ_TRERR_STACKOV);
      }
      local_40->nres = lVar7;
      lVar10 = 0;
      do {
        TVar1 = lj_ir_kint(J,(int32_t)lVar10);
        (J->fold).ins.field_0.ot = 0x2913;
        (J->fold).ins.field_0.op1 = IVar9;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
        TVar1 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x3f05;
        (J->fold).ins.field_0.op1 = IVar6;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
        TVar1 = lj_opt_fold(J);
        (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45100001;
        TVar1 = lj_opt_fold(J);
        J->base[lVar10] = TVar1;
        lVar10 = lVar10 + 1;
      } while (lVar7 != lVar10);
    }
  }
  else {
    if ((int)MVar4 < (int)local_44) {
      (J->fold).ins.field_0.ot = 0x93;
      (J->fold).ins.field_0.op1 = IVar8;
      (J->fold).ins.field_0.op2 = IVar9;
      lj_opt_fold(J);
      TVar1 = lj_ir_kgc(J,(GCobj *)(J[-1].penalty + 0x3a),IRT_STR);
    }
    else {
      (J->fold).ins.field_0.ot = 0x2a13;
      (J->fold).ins.field_0.op1 = IVar8;
      (J->fold).ins.field_0.op2 = IVar9;
      TVar1 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x193;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
      lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x3f05;
      (J->fold).ins.field_0.op1 = IVar6;
      (J->fold).ins.field_0.op2 = IVar9;
      TVar2 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x4d04;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
      TVar1 = lj_opt_fold(J);
    }
    *J->base = TVar1;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_string_range(jit_State *J, RecordFFData *rd)
{
  TRef trstr = lj_ir_tostr(J, J->base[0]);
  TRef trlen = emitir(IRTI(IR_FLOAD), trstr, IRFL_STR_LEN);
  TRef tr0 = lj_ir_kint(J, 0);
  TRef trstart, trend;
  GCstr *str = argv2str(J, &rd->argv[0]);
  int32_t start, end;
  if (rd->data) {  /* string.sub(str, start [,end]) */
    start = argv2int(J, &rd->argv[1]);
    trstart = lj_opt_narrow_toint(J, J->base[1]);
    trend = J->base[2];
    if (tref_isnil(trend)) {
      trend = lj_ir_kint(J, -1);
      end = -1;
    } else {
      trend = lj_opt_narrow_toint(J, trend);
      end = argv2int(J, &rd->argv[2]);
    }
  } else {  /* string.byte(str, [,start [,end]]) */
    if (tref_isnil(J->base[1])) {
      start = 1;
      trstart = lj_ir_kint(J, 1);
    } else {
      start = argv2int(J, &rd->argv[1]);
      trstart = lj_opt_narrow_toint(J, J->base[1]);
    }
    if (J->base[1] && !tref_isnil(J->base[2])) {
      trend = lj_opt_narrow_toint(J, J->base[2]);
      end = argv2int(J, &rd->argv[2]);
    } else {
      trend = trstart;
      end = start;
    }
  }
  if (end < 0) {
    emitir(IRTGI(IR_LT), trend, tr0);
    trend = emitir(IRTI(IR_ADD), emitir(IRTI(IR_ADD), trlen, trend),
		   lj_ir_kint(J, 1));
    end = end+(int32_t)str->len+1;
  } else if ((MSize)end <= str->len) {
    emitir(IRTGI(IR_ULE), trend, trlen);
  } else {
    emitir(IRTGI(IR_UGT), trend, trlen);
    end = (int32_t)str->len;
    trend = trlen;
  }
  trstart = recff_string_start(J, str, &start, trstart, trlen, tr0);
  if (rd->data) {  /* Return string.sub result. */
    if (end - start >= 0) {
      /* Also handle empty range here, to avoid extra traces. */
      TRef trptr, trslen = emitir(IRTI(IR_SUB), trend, trstart);
      emitir(IRTGI(IR_GE), trslen, tr0);
      trptr = emitir(IRT(IR_STRREF, IRT_PGC), trstr, trstart);
      J->base[0] = emitir(IRT(IR_SNEW, IRT_STR), trptr, trslen);
    } else {  /* Range underflow: return empty string. */
      emitir(IRTGI(IR_LT), trend, trstart);
      J->base[0] = lj_ir_kstr(J, &J2G(J)->strempty);
    }
  } else {  /* Return string.byte result(s). */
    ptrdiff_t i, len = end - start;
    if (len > 0) {
      TRef trslen = emitir(IRTI(IR_SUB), trend, trstart);
      emitir(IRTGI(IR_EQ), trslen, lj_ir_kint(J, (int32_t)len));
      if (J->baseslot + len > LJ_MAX_JSLOTS)
	lj_trace_err_info(J, LJ_TRERR_STACKOV);
      rd->nres = len;
      for (i = 0; i < len; i++) {
	TRef tmp = emitir(IRTI(IR_ADD), trstart, lj_ir_kint(J, (int32_t)i));
	tmp = emitir(IRT(IR_STRREF, IRT_PGC), trstr, tmp);
	J->base[i] = emitir(IRT(IR_XLOAD, IRT_U8), tmp, IRXLOAD_READONLY);
      }
    } else {  /* Empty range or range underflow: return no results. */
      emitir(IRTGI(IR_LE), trend, trstart);
      rd->nres = 0;
    }
  }
}